

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Lookup(ShardedLRUCache *this,Slice *key)

{
  LRUHandle *pLVar1;
  LRUHandle *pLVar2;
  LRUHandle *pLVar3;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  LRUHandle **ppLVar7;
  Mutex *__mutex;
  
  uVar4 = Hash(key->data_,key->size_,0);
  uVar5 = uVar4 >> 0x1c;
  __mutex = &this->shard_[uVar5].mutex_;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar6 == 0) {
    ppLVar7 = HandleTable::FindPointer
                        ((HandleTable *)(ulong)this->shard_[uVar5].table_.length_,
                         (Slice *)this->shard_[uVar5].table_.list_,(uint32_t)key->data_);
    pLVar1 = *ppLVar7;
    if (pLVar1 != (LRUHandle *)0x0) {
      uVar4 = pLVar1->refs;
      if ((uVar4 == 1) && (pLVar1->in_cache == true)) {
        pLVar2 = pLVar1->next;
        pLVar3 = pLVar1->prev;
        pLVar2->prev = pLVar3;
        pLVar3->next = pLVar2;
        pLVar1->next = &this->shard_[uVar5].in_use_;
        pLVar2 = this->shard_[uVar5].in_use_.prev;
        pLVar1->prev = pLVar2;
        pLVar2->next = pLVar1;
        pLVar1->next->prev = pLVar1;
      }
      pLVar1->refs = uVar4 + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return (Handle *)pLVar1;
  }
  std::__throw_system_error(iVar6);
}

Assistant:

Handle* Lookup(const Slice& key) override {
    const uint32_t hash = HashSlice(key);
    return shard_[Shard(hash)].Lookup(key, hash);
  }